

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# forestdb.cc
# Opt level: O1

fdb_status fdb_get_byoffset_raw(fdb_kvs_handle *handle,fdb_doc *doc)

{
  atomic<unsigned_long> *paVar1;
  ushort uVar2;
  uint64_t offset;
  fdb_kvs_id_t fVar3;
  undefined1 auVar4 [14];
  undefined1 auVar5 [14];
  undefined1 auVar6 [14];
  uint uVar7;
  fdb_status fVar8;
  int64_t iVar9;
  size_t sVar10;
  bool bVar11;
  ushort uVar12;
  undefined1 auVar13 [16];
  docio_object _doc;
  fdb_kvs_id_t kv_id;
  docio_object local_68;
  fdb_kvs_id_t local_28;
  undefined6 uVar14;
  
  if (handle == (fdb_kvs_handle *)0x0) {
    return FDB_RESULT_INVALID_HANDLE;
  }
  if (doc == (fdb_doc *)0x0) {
    fVar8 = FDB_RESULT_INVALID_ARGS;
  }
  else {
    offset = doc->offset;
    fVar8 = FDB_RESULT_INVALID_ARGS;
    if (1 < offset + 1) {
      LOCK();
      bVar11 = (handle->handle_busy).super___atomic_base<unsigned_char>._M_i == '\0';
      if (bVar11) {
        (handle->handle_busy).super___atomic_base<unsigned_char>._M_i = '\x01';
      }
      UNLOCK();
      fVar8 = FDB_RESULT_HANDLE_BUSY;
      if (bVar11) {
        LOCK();
        paVar1 = &handle->op_stats->num_gets;
        (paVar1->super___atomic_base<unsigned_long>)._M_i =
             (paVar1->super___atomic_base<unsigned_long>)._M_i + 1;
        UNLOCK();
        local_68.field_3.seqnum = 0;
        local_68.meta = (void *)0x0;
        local_68.timestamp = 0;
        local_68._20_4_ = 0;
        local_68.key = (void *)0x0;
        local_68.length.keylen = 0;
        local_68.length.metalen = 0;
        local_68.length.bodylen = 0;
        local_68.length.bodylen_ondisk = 0;
        local_68.length.flag = '\0';
        local_68.length.checksum = '\0';
        local_68.length.reserved = 0;
        local_68.body = (void *)0x0;
        iVar9 = docio_read_doc(handle->dhandle,offset,&local_68,true);
        if ((local_68.key == (void *)0x0 || iVar9 < 1) ||
           (((undefined1  [16])local_68.length & (undefined1  [16])0x1000000000) !=
            (undefined1  [16])0x0)) {
          LOCK();
          if ((handle->handle_busy).super___atomic_base<unsigned_char>._M_i == '\x01') {
            (handle->handle_busy).super___atomic_base<unsigned_char>._M_i = '\0';
          }
          UNLOCK();
          fVar8 = FDB_RESULT_KEY_NOT_FOUND;
          if (iVar9 < 0) {
            fVar8 = (fdb_status)iVar9;
          }
        }
        else {
          if (handle->kvs != (kvs_info *)0x0) {
            buf2kvid((ulong)(handle->config).chunksize,local_68.key,&local_28);
            fVar3 = handle->kvs->id;
            if (local_28 == fVar3) {
              uVar2 = (handle->config).chunksize;
              uVar7 = local_68.length._0_4_ - (uint)uVar2;
              local_68.length.keylen = (keylen_t)uVar7;
              memmove(local_68.key,(void *)((ulong)uVar2 + (long)local_68.key),
                      (ulong)(uVar7 & 0xffff));
            }
            else {
              LOCK();
              if ((handle->handle_busy).super___atomic_base<unsigned_char>._M_i == '\x01') {
                (handle->handle_busy).super___atomic_base<unsigned_char>._M_i = '\0';
              }
              UNLOCK();
              free_docio_object(&local_68,'\x01','\x01','\x01');
            }
            if (local_28 != fVar3) {
              return FDB_RESULT_KEY_NOT_FOUND;
            }
          }
          doc->seqnum = (fdb_seqnum_t)local_68.field_3;
          auVar4._10_2_ = 0;
          auVar4._0_10_ = local_68.length._0_10_;
          auVar4._12_2_ = local_68.length.bodylen._2_2_;
          auVar5._8_2_ = (short)local_68.length.bodylen;
          auVar5._0_8_ = local_68.length._0_8_;
          auVar5._10_4_ = auVar4._10_4_;
          auVar6._6_8_ = 0;
          auVar6._0_6_ = auVar5._8_6_;
          uVar12 = local_68.length.keylen;
          uVar14 = 0;
          auVar13._0_8_ = CONCAT62(uVar14,uVar12);
          auVar13._8_4_ = (int)CONCAT82(SUB148(auVar6 << 0x40,6),local_68.length.metalen);
          auVar13._12_4_ = 0;
          doc->keylen = auVar13._0_8_;
          doc->metalen = auVar13._8_8_;
          doc->bodylen = (ulong)local_68.length.bodylen;
          if (doc->key == (void *)0x0) {
            doc->key = local_68.key;
          }
          else {
            free(local_68.key);
          }
          if (doc->meta == (void *)0x0) {
            doc->meta = local_68.meta;
          }
          else {
            free(local_68.meta);
          }
          if (doc->body == (void *)0x0) {
            doc->body = local_68.body;
          }
          else {
            if ((ulong)local_68.length.bodylen != 0) {
              memcpy(doc->body,local_68.body,(ulong)local_68.length.bodylen);
            }
            free(local_68.body);
          }
          doc->deleted = (bool)(local_68.length.flag >> 2 & 1);
          sVar10 = (ulong)((local_68.length._0_4_ & 0xffff) + ((uint)local_68.length._0_4_ >> 0x10)
                          + local_68.length.bodylen_ondisk) + 0x20;
          doc->size_ondisk = sVar10;
          if (handle->kvs != (kvs_info *)0x0) {
            doc->size_ondisk = sVar10 + (handle->config).chunksize;
          }
          LOCK();
          if ((handle->handle_busy).super___atomic_base<unsigned_char>._M_i == '\x01') {
            (handle->handle_busy).super___atomic_base<unsigned_char>._M_i = '\0';
          }
          UNLOCK();
          fVar8 = (uint)(((undefined1  [13])local_68.length._0_13_ & (undefined1  [13])0x400000000)
                        == (undefined1  [13])0x0) * 9 + FDB_RESULT_KEY_NOT_FOUND;
        }
      }
    }
  }
  return fVar8;
}

Assistant:

LIBFDB_API
fdb_status fdb_get_byoffset_raw(fdb_kvs_handle *handle, fdb_doc *doc)
{
    if (!handle) {
        return FDB_RESULT_INVALID_HANDLE;
    }

    if (!doc) {
        return FDB_RESULT_INVALID_ARGS;
    }

    uint64_t offset = doc->offset;
    struct docio_object _doc;

    if (!offset || offset == BLK_NOT_FOUND) {
        return FDB_RESULT_INVALID_ARGS;
    }

    if (!atomic_cas_uint8_t(&handle->handle_busy, 0, 1)) {
        return FDB_RESULT_HANDLE_BUSY;
    }

    atomic_incr_uint64_t(&handle->op_stats->num_gets, std::memory_order_relaxed);
    memset(&_doc, 0, sizeof(struct docio_object));

    int64_t _offset = docio_read_doc(handle->dhandle, offset, &_doc, true);
    if (_offset <= 0 || !_doc.key || (_doc.length.flag & DOCIO_TXN_COMMITTED)) {
        atomic_cas_uint8_t(&handle->handle_busy, 1, 0);
        return _offset < 0 ? (fdb_status)_offset : FDB_RESULT_KEY_NOT_FOUND;
    }

    if (handle->kvs) {
        fdb_kvs_id_t kv_id;
        buf2kvid(handle->config.chunksize, _doc.key, &kv_id);
        if (kv_id != handle->kvs->id) {
            atomic_cas_uint8_t(&handle->handle_busy, 1, 0);
            free_docio_object(&_doc, 1, 1, 1);
            return FDB_RESULT_KEY_NOT_FOUND;
        }
        _remove_kv_id(handle, &_doc);
    }

    doc->seqnum = _doc.seqnum;
    doc->keylen = _doc.length.keylen;
    doc->metalen = _doc.length.metalen;
    doc->bodylen = _doc.length.bodylen;
    if (doc->key) {
        free(_doc.key);
    } else {
        doc->key = _doc.key;
    }
    if (doc->meta) {
        free(_doc.meta);
    } else {
        doc->meta = _doc.meta;
    }
    if (doc->body) {
        if (_doc.length.bodylen > 0) {
            memcpy(doc->body, _doc.body, _doc.length.bodylen);
        }
        free(_doc.body);
    } else {
        doc->body = _doc.body;
    }
    doc->deleted = _doc.length.flag & DOCIO_DELETED;
    doc->size_ondisk = _fdb_get_docsize(_doc.length);
    if (handle->kvs) {
        // Since _doc.length was adjusted in _remove_kv_id(),
        // we need to compensate it.
        doc->size_ondisk += handle->config.chunksize;
    }

    if (_doc.length.flag & DOCIO_DELETED) {
        atomic_cas_uint8_t(&handle->handle_busy, 1, 0);
        return FDB_RESULT_KEY_NOT_FOUND;
    }

    atomic_cas_uint8_t(&handle->handle_busy, 1, 0);
    return FDB_RESULT_SUCCESS;
}